

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureStandard::~IfcFurnitureStandard(IfcFurnitureStandard *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcControl).super_IfcObject + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcControl).super_IfcObject.field_0x0 + lVar3);
  pvVar2 = &(this->super_IfcControl).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20 + lVar3;
  *(undefined8 *)((long)pvVar2 + -0xb8) = 0x8ef3a8;
  *(undefined8 *)((long)pvVar2 + 0x38) = 0x8ef420;
  *(undefined8 *)((long)pvVar2 + -0x30) = 0x8ef3d0;
  *(undefined8 *)((long)pvVar2 + -0x20) = 0x8ef3f8;
  if (*(void **)((long)pvVar2 + -0x10) != pvVar2) {
    operator_delete(*(void **)((long)pvVar2 + -0x10));
  }
  *puVar1 = 0x8ef4c0;
  puVar1[0x1e] = 0x8ef4e8;
  if ((undefined8 *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((undefined8 *)puVar1[0xc]);
  }
  if ((undefined8 *)puVar1[7] != puVar1 + 9) {
    operator_delete((undefined8 *)puVar1[7]);
  }
  if ((undefined8 *)puVar1[2] != puVar1 + 4) {
    operator_delete((undefined8 *)puVar1[2]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcFurnitureStandard() : Object("IfcFurnitureStandard") {}